

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O2

var * __thiscall
cs::domain_manager::get_var_current<cs::var_id_const&>(domain_manager *this,var_id *name)

{
  domain_type *this_00;
  var *pvVar1;
  stack_pointer this_01;
  
  this_01 = &this->m_data;
  if (*this->fiber_stack != (stack_pointer)0x0) {
    this_01 = *this->fiber_stack;
  }
  this_00 = stack_type<cs::domain_type,_std::allocator>::top(this_01);
  pvVar1 = domain_type::get_var(this_00,name);
  return pvVar1;
}

Assistant:

var &get_var_current(T &&name)
		{
			if (fiber_stack != nullptr)
				return fiber_stack->top().get_var(name);
			else
				return m_data.top().get_var(name);
		}